

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O0

void __thiscall
RasterizerA3<32U>::_addLine<long>(RasterizerA3<32U> *this,long x0,long y0,long x1,long y1)

{
  BitWord *pBVar1;
  ulong uVar2;
  uint32_t uVar3;
  int iVar4;
  uint a;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool local_109;
  uint local_fc;
  uint local_f8;
  int coverAcc;
  int fx1;
  int yAcc;
  long p_1;
  long p;
  long yDlt;
  long yRem;
  long yLift;
  long yBase;
  long yErr;
  long xDlt;
  long xRem;
  long xLift;
  long xBase;
  long xErr;
  BitWord bitMask;
  BitWord *bitBase;
  size_t bitIndex;
  uint32_t local_70;
  uint32_t ey1;
  int j;
  int i;
  int fy1;
  int ex1;
  int fy0;
  int ey0;
  int fx0;
  int ex0;
  int coverSign;
  int yInc;
  int area;
  int cover;
  long dy;
  long dx;
  long y1_local;
  long x1_local;
  long y0_local;
  long x0_local;
  RasterizerA3<32U> *this_local;
  
  dy = x1 - x0;
  _area = y1 - y0;
  if (_area != 0) {
    yInc = (int)_area;
    if (dy < 0) {
      dy = -dy;
    }
    if (_area < 0) {
      _area = -_area;
    }
    ex0 = 1;
    fx0 = 1;
    dx = y1;
    y1_local = x1;
    x1_local = y0;
    y0_local = x0;
    x0_local = (long)this;
    if (x1 < x0) {
      std::swap<long>(&y0_local,&y1_local);
      std::swap<long>(&x1_local,&dx);
      fx0 = -1;
    }
    if (dx < x1_local) {
      iVar4 = 1;
      if (((uint)(x1_local ^ 0xffU) & 0xff) == 0xff) {
        iVar4 = -0x1ff;
      }
      x1_local = (long)iVar4 + (x1_local ^ 0xffU);
      dx = x1_local + _area;
      ex0 = -1;
      fx0 = -fx0;
    }
    ey0 = (int)((ulong)y0_local >> 8);
    fy0 = (uint)y0_local & 0xff;
    ex1 = (int)((ulong)x1_local >> 8);
    fy1 = (uint)x1_local & 0xff;
    uVar2 = (ulong)y1_local >> 8;
    j = (uint)dx & 0xff;
    ey1 = 1;
    local_70 = (int)((ulong)dx >> 8) - ex1;
    if (local_70 == 0 && fy0 + (int)dy < 0x101) {
      Bounds::union_(&this->_yBounds,ex1,ex1);
      IntUtils::bitVectorSetBit<unsigned_long>
                (this->_bits + (long)ex1 * this->_bitStride,(ulong)((uint)ey0 >> 5),true);
      _mergeCell(this,ey0,ex1,yInc,(fy0 * 2 + (int)dy) * yInc);
    }
    else {
      a = ex1 + (local_70 + ((dx & 0xffU) != 0)) * ex0;
      if (a < (uint)ex1) {
        Bounds::union_(&this->_yBounds,a,ex1);
      }
      else {
        Bounds::union_(&this->_yBounds,ex1,a);
      }
      if (dy != 0) {
        xBase = -_area / 2;
        yErr = dy;
        yBase = -dy / 2;
        p._0_4_ = (int)_area;
        lVar8 = (dy << 8) / _area;
        lVar9 = (dy << 8) % _area;
        lVar10 = (_area << 8) % dy;
        if (local_70 != 0) {
          lVar7 = (0x100 - fy1) * dy;
          yErr = lVar7 / _area;
          xBase = lVar7 % _area + xBase;
          j = 0x100;
        }
        if (ey0 != (uint)uVar2) {
          lVar7 = (0x100 - fy0) * _area;
          p._0_4_ = (int)(lVar7 / dy);
          yBase = lVar7 % dy + yBase;
        }
        yInc = (int)p;
        iVar4 = (int)((_area << 8) / dy);
        if (_area < dy) {
          local_fc = (int)p + fy1;
          if (local_70 != 0) {
            j = 0x100;
          }
          if (fy0 + (int)yErr < 0x101) {
            y0_local = yErr + y0_local;
            yInc = (j - fy1) * fx0;
            coverSign = (fy0 * 2 + (int)yErr) * yInc;
            goto LAB_00133123;
          }
          do {
            y0_local = yErr + y0_local;
            i = (int)((ulong)y0_local >> 8);
            local_f8 = (uint)y0_local & 0xff;
            if (ey0 == i) {
              __assert_fail("ex0 != ex1",
                            "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                            ,0x1e7,
                            "void RasterizerA3<32>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 32, Fixed = long]"
                           );
            }
            if ((y0_local & 0xffU) == 0) {
              local_f8 = 0x100;
            }
            else {
              i = i + 1;
            }
            coverSign = (fy0 + 0x100) * yInc;
            IntUtils::bitVectorFill<unsigned_long>
                      (this->_bits + (long)ex1 * this->_bitStride,(ulong)((uint)ey0 >> 5),
                       (ulong)((((uint)i >> 5) - ((uint)ey0 >> 5)) + 1));
            for (; ey0 != i + -1; ey0 = ey0 + 1) {
              _mergeCell(this,ey0,ex1,yInc * fx0,coverSign * fx0);
              yBase = lVar10 + yBase;
              yInc = iVar4;
              if (-1 < yBase) {
                yBase = yBase - dy;
                yInc = iVar4 + 1;
              }
              local_fc = yInc + local_fc;
              coverSign = yInc << 8;
            }
            iVar6 = (j - local_fc) + yInc;
            _mergeCell(this,ey0,ex1,iVar6 * fx0,local_f8 * iVar6 * fx0);
            if (local_f8 == 0x100) {
              local_fc = iVar4 + local_fc;
              yBase = lVar10 + yBase;
              if (-1 < yBase) {
                yBase = yBase - dy;
                local_fc = local_fc + 1;
              }
            }
            ex1 = ex0 + ex1;
            ey1 = ey1 - 1;
            if (ey1 == 0) {
              if (ex1 == a) {
                return;
              }
              do {
                uVar3 = local_70;
                ey1 = local_70;
                local_70 = 1;
                if (1 < (int)uVar3) {
                  j = 0x100;
                  ey1 = uVar3 - 1;
                  break;
                }
                j = (uint)dx & 0xff;
                yErr = y1_local - y0_local;
                ey0 = (int)((ulong)y0_local >> 8);
                fy0 = (uint)y0_local & 0xff;
                if (0x100 < fy0 + (int)yErr) goto LAB_0013326f;
                yInc = j * fx0;
                coverSign = (fy0 * 2 + (int)yErr) * yInc;
LAB_00133123:
                IntUtils::bitVectorSetBit<unsigned_long>
                          (this->_bits + (long)ex1 * this->_bitStride,(ulong)((uint)ey0 >> 5),true);
                _mergeCell(this,ey0,ex1,yInc,coverSign);
                ex1 = ex0 + ex1;
                if (ex1 == a) {
                  return;
                }
                if (fy0 + (int)yErr == 0x100) {
                  local_fc = iVar4 + local_fc;
                  yBase = lVar10 + yBase;
                  if (-1 < yBase) {
                    yBase = yBase - dy;
                    local_fc = local_fc + 1;
                  }
                }
                ey1 = ey1 - 1;
              } while (ey1 == 0);
            }
            xBase = lVar9 + xBase;
            yErr = lVar8;
            if (-1 < xBase) {
              xBase = xBase - _area;
              yErr = lVar8 + 1;
            }
            ey0 = (int)((ulong)y0_local >> 8);
            fy0 = (uint)y0_local & 0xff;
LAB_0013326f:
            local_fc = local_fc - 0x100;
            local_109 = 0x100 < local_fc;
            yInc = local_fc;
            if (local_109) {
              __assert_fail("cover >= 0 && cover <= 256",
                            "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                            ,0x1e0,
                            "void RasterizerA3<32>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 32, Fixed = long]"
                           );
            }
          } while( true );
        }
        coverAcc = (int)x1_local + (int)p;
LAB_00132e2e:
        do {
          uVar3 = local_70;
          uVar5 = (int)yErr + fy0;
          if ((int)uVar5 < 0x101) {
            iVar6 = (j - fy1) * fx0;
            IntUtils::bitVectorSetBit<unsigned_long>
                      (this->_bits + (long)ex1 * this->_bitStride,(ulong)((uint)ey0 >> 5),true);
            _mergeCell(this,ey0,ex1,iVar6,(fy0 + uVar5) * iVar6);
            fy0 = uVar5;
            if (uVar5 == 0x100) {
              fy0 = 0;
              goto LAB_00132fc1;
            }
          }
          else {
            coverAcc = coverAcc & 0xff;
            iVar6 = (coverAcc - fy1) * fx0;
            IntUtils::bitVectorSetBit<unsigned_long>
                      (this->_bits + (long)ex1 * this->_bitStride,(ulong)((uint)ey0 >> 5),true);
            _mergeCell(this,ey0,ex1,iVar6,(fy0 + 0x100) * iVar6);
            iVar6 = (j - coverAcc) * fx0;
            IntUtils::bitVectorSetBit<unsigned_long>
                      (this->_bits + (long)ex1 * this->_bitStride,(ulong)(ey0 + 1U >> 5),true);
            _mergeCell(this,ey0 + 1U,ex1,iVar6,(uVar5 & 0xff) * iVar6);
            fy0 = uVar5 & 0xff;
LAB_00132fc1:
            ey0 = ey0 + 1;
            coverAcc = iVar4 + coverAcc;
            yBase = lVar10 + yBase;
            if (-1 < yBase) {
              yBase = yBase - dy;
              coverAcc = coverAcc + 1;
            }
          }
          ex1 = ex0 + ex1;
          ey1 = ey1 - 1;
          if (ey1 == 0) {
            if (ex1 == a) {
              return;
            }
            ey1 = local_70;
            local_70 = 1;
            if ((int)uVar3 < 2) {
              fy1 = 0;
              j = (uint)dx & 0xff;
              yErr = (y1_local - (ey0 << 8)) - (long)fy0;
              goto LAB_00132e2e;
            }
            fy1 = 0;
            j = 0x100;
            ey1 = uVar3 - 1;
          }
          xBase = lVar9 + xBase;
          yErr = lVar8;
          if (-1 < xBase) {
            xBase = xBase - _area;
            yErr = lVar8 + 1;
          }
        } while( true );
      }
      if (0 < (int)local_70) {
        yInc = (0x100 - fy1) * fx0;
      }
      pBVar1 = this->_bits;
      while( true ) {
        uVar3 = local_70;
        do {
          lVar8 = (long)ex1 * this->_bitStride;
          pBVar1[(ulong)((uint)ey0 >> 0xb) + lVar8] =
               1L << ((byte)((uint)ey0 >> 5) & 0x3f) | pBVar1[(ulong)((uint)ey0 >> 0xb) + lVar8];
          _mergeCell(this,ey0,ex1,yInc,fy0 * 2 * yInc);
          ex1 = ex0 + ex1;
          ey1 = ey1 - 1;
        } while (ey1 != 0);
        if (ex1 == a) break;
        ey1 = local_70;
        local_70 = 1;
        yInc = fx0 * j;
        if (1 < (int)uVar3) {
          ey1 = uVar3 - 1;
          yInc = fx0 << 8;
        }
      }
    }
  }
  return;
}

Assistant:

void RasterizerA3<N>::_addLine(Fixed x0, Fixed y0, Fixed x1, Fixed y1) noexcept {
  Fixed dx = x1 - x0;
  Fixed dy = y1 - y0;

  if (dy == Fixed(0))
    return;

  int cover = int(dy);
  int area;

  if (dx < 0) dx = -dx;
  if (dy < 0) dy = -dy;

  int yInc = 1;
  int coverSign = 1;

  // Fix RIGHT-TO-LEFT direction:
  //   - swap coordinates,
  //   - invert cover-sign.
  if (x0 > x1) {
    std::swap(x0, x1);
    std::swap(y0, y1);
    coverSign = -coverSign;
  }

  // Fix BOTTOM-TO-TOP direction:
  //   - invert fractional parts of y0 and y1,
  //   - invert cover-sign.
  if (y0 > y1) {
    y0 ^= kA8Mask;
    y0 += int(y0 & kA8Mask) == kA8Mask ? 1 - kA8Scale * 2 : 1;
    y1  = y0 + dy;

    yInc = -1;
    coverSign = -coverSign;
  }

  // Extract the raster and fractional coordinates.
  int ex0 = int(x0 >> kA8Shift);
  int fx0 = int(x0 & kA8Mask);

  int ey0 = int(y0 >> kA8Shift);
  int fy0 = int(y0 & kA8Mask);

  int ex1 = int(x1 >> kA8Shift);
  int fy1 = int(y1 & kA8Mask);

  // NOTE: Variable `i` is just a loop counter. We need to make sure to handle
  // the start and end points of the line, which use the same loop body, but
  // require special handling.
  //
  //   - `i` - How many Y iterations to do now.
  //   - `j` - How many Y iterations to do next.
  int i = 1;
  int j = int(y1 >> kA8Shift) - ey0;

  // Single-Cell.
  if ((j | ((fx0 + int(dx)) > 256)) == 0) {
    _yBounds.union_(ey0, ey0);
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);

    _mergeCell(ex0, ey0, cover, (fx0 * 2 + int(dx)) * cover);
    return;
  }

  uint32_t ey1 = ey0 + (j + (fy1 != 0)) * yInc;
  if (ey0 <= ey1)
    _yBounds.union_(ey0, ey1);
  else
    _yBounds.union_(ey1, ey0);

  // Strictly horizontal line (always one cell per scanline).
  if (dx == 0) {
    if (j > 0)
      cover = (kA8Scale - fy0) * coverSign;

    fy0  = coverSign << kA8Shift;
    fy1 *= coverSign;
    fx0 *= 2;

    size_t bitIndex = ex0 / kPixelsPerOneBit;
    BitWord* bitBase = _bits + (bitIndex / kBitWordBits);
    BitWord bitMask = BitWord(1) << (bitIndex % kBitWordBits);

    for (;;) {
      area = fx0 * cover;
      do {
        bitBase[ey0 * _bitStride] |= bitMask;
        _mergeCell(ex0, ey0, cover, area);
        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      cover = fy1;
      i = j;
      j = 1;

      if (i <= 1)
        continue;

      cover = fy0;
      i--;
    }

    return;
  }

  Fixed xErr = -dy / 2, xBase, xLift, xRem, xDlt = dx;
  Fixed yErr = -dx / 2, yBase, yLift, yRem, yDlt = dy;

  xBase = dx * kA8Scale;
  xLift = xBase / dy;
  xRem  = xBase % dy;

  yBase = dy * kA8Scale;
  yLift = yBase / dx;
  yRem  = yBase % dx;

  if (j != 0) {
    Fixed p = Fixed(kA8Scale - fy0) * dx;
    xDlt  = p / dy;
    xErr += p % dy;
    fy1 = kA8Scale;
  }

  if (ex0 != ex1) {
    Fixed p = Fixed(kA8Scale - fx0) * dy;
    yDlt = p / dx;
    yErr += p % dx;
  }

  // Vertical direction -> One/Two cells per scanline.
  if (dy >= dx) {
    int yAcc = int(y0) + int(yDlt);

    goto VertSkip;
    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

VertSkip:
        area = fx0;
        fx0 += int(xDlt);

        if (fx0 <= 256) {
          cover = (fy1 - fy0) * coverSign;
          area  = (area + fx0) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

          if (fx0 == 256) {
            ex0++;
            fx0 = 0;
            goto VertAdvance;
          }
        }
        else {
          yAcc &= 0xFF;
          fx0  &= kA8Mask;

          cover = (yAcc - fy0) * coverSign;
          area  = (area + kA8Scale) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);
          ex0++;

          cover = (fy1 - yAcc) * coverSign;
          area  = fx0 * cover;
          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

VertAdvance:
          yAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; yAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      i = j;
      j = 1;

      if (i > 1) {
        fy0 = 0;
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy0 = 0;
        fy1 = int(y1 & kA8Mask);

        xDlt = x1 - (ex0 << 8) - fx0;
        goto VertSkip;
      }
    }

    return;
  }
  // Horizontal direction -> Two or more cells per scanline.
  else {
    int fx1;
    int coverAcc = fy0;

    cover = int(yDlt);
    coverAcc += cover;

    if (j != 0)
      fy1 = kA8Scale;

    if (fx0 + int(xDlt) > 256)
      goto HorzInside;

    x0 += xDlt;

    cover = (fy1 - fy0) * coverSign;
    area = (fx0 * 2 + int(xDlt)) * cover;

HorzSingle:
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
    _mergeCell(ex0, ey0, cover, area);

    ey0 += yInc;
    if (ey0 == ey1)
      return;

    if (fx0 + int(xDlt) == 256) {
      coverAcc += int(yLift);
      yErr += yRem;
      if (yErr >= 0) { yErr -= dx; coverAcc++; }
    }

    if (--i == 0)
      goto HorzAfter;

    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

HorzSkip:
        coverAcc -= 256;
        cover = coverAcc;
        assert(cover >= 0 && cover <= 256);

HorzInside:
        x0 += xDlt;

        ex1 = int(x0 >> kA8Shift);
        fx1 = int(x0 & kA8Mask);
        assert(ex0 != ex1);

        if (fx1 == 0)
          fx1 = kA8Scale;
        else
          ex1++;

        area = (fx0 + kA8Scale) * cover;
        IntUtils::bitVectorFill(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, (ex1 / kPixelsPerOneBit) - (ex0 / kPixelsPerOneBit) + 1);

        while (ex0 != ex1 - 1) {
          _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

          cover = int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; cover++; }

          coverAcc += cover;
          area  = kA8Scale * cover;

          ex0++;
        }

        cover += fy1 - coverAcc;
        area   = fx1 * cover;
        _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

        if (fx1 == kA8Scale) {
          coverAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; coverAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

HorzAfter:
      i = j;
      j = 1;

      if (i > 1) {
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy1 = int(y1 & kA8Mask);
        xDlt = x1 - x0;

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

        if (fx0 + int(xDlt) <= 256) {
          cover = fy1 * coverSign;
          area = (fx0 * 2 + int(xDlt)) * cover;
          goto HorzSingle;
        }
        else {
          goto HorzSkip;
        }
      }
    }

    return;
  }
}